

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int nodePush(xmlParserCtxtPtr ctxt,xmlNodePtr value)

{
  xmlNodePtr *ppxVar1;
  xmlNodePtr *tmp;
  xmlNodePtr value_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    ctxt_local._4_4_ = 0;
  }
  else {
    if (ctxt->nodeMax <= ctxt->nodeNr) {
      ppxVar1 = (xmlNodePtr *)(*xmlRealloc)(ctxt->nodeTab,(long)(ctxt->nodeMax << 1) << 3);
      if (ppxVar1 == (xmlNodePtr *)0x0) {
        xmlErrMemory(ctxt,(char *)0x0);
        return -1;
      }
      ctxt->nodeTab = ppxVar1;
      ctxt->nodeMax = ctxt->nodeMax << 1;
    }
    if ((xmlParserMaxDepth < (uint)ctxt->nodeNr) && ((ctxt->options & 0x80000U) == 0)) {
      xmlFatalErrMsgInt(ctxt,XML_ERR_INTERNAL_ERROR,
                        "Excessive depth in document: %d use XML_PARSE_HUGE option\n",
                        xmlParserMaxDepth);
      xmlHaltParser(ctxt);
      ctxt_local._4_4_ = -1;
    }
    else {
      ctxt->nodeTab[ctxt->nodeNr] = value;
      ctxt->node = value;
      ctxt_local._4_4_ = ctxt->nodeNr;
      ctxt->nodeNr = ctxt_local._4_4_ + 1;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
nodePush(xmlParserCtxtPtr ctxt, xmlNodePtr value)
{
    if (ctxt == NULL) return(0);
    if (ctxt->nodeNr >= ctxt->nodeMax) {
        xmlNodePtr *tmp;

	tmp = (xmlNodePtr *) xmlRealloc(ctxt->nodeTab,
                                      ctxt->nodeMax * 2 *
                                      sizeof(ctxt->nodeTab[0]));
        if (tmp == NULL) {
            xmlErrMemory(ctxt, NULL);
            return (-1);
        }
        ctxt->nodeTab = tmp;
	ctxt->nodeMax *= 2;
    }
    if ((((unsigned int) ctxt->nodeNr) > xmlParserMaxDepth) &&
        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
	xmlFatalErrMsgInt(ctxt, XML_ERR_INTERNAL_ERROR,
		 "Excessive depth in document: %d use XML_PARSE_HUGE option\n",
			  xmlParserMaxDepth);
	xmlHaltParser(ctxt);
	return(-1);
    }
    ctxt->nodeTab[ctxt->nodeNr] = value;
    ctxt->node = value;
    return (ctxt->nodeNr++);
}